

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O3

void __thiscall
OPNMIDIplay::noteUpdate
          (OPNMIDIplay *this,size_t midCh,notes_iterator i,uint props_mask,int32_t select_adlchn)

{
  uint32_t *puVar1;
  ushort uVar2;
  uint uVar3;
  pointer pOVar4;
  pl_cell<OPNMIDIplay::OpnChannel::LocationData> *ppVar5;
  NoteHook p_Var6;
  pointer pMVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  OPN2 *this_00;
  users_iterator uVar13;
  pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData> *ppVar14;
  pl_cell<OPNMIDIplay::OpnChannel::LocationData> *ppVar15;
  uint uVar16;
  byte bVar17;
  byte bVar18;
  Phys *pPVar19;
  OpnChannel *this_01;
  long lVar20;
  ulong uVar21;
  double c;
  OpnTimbre *instrument;
  Phys *ph;
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  Location my_loc;
  Location local_ac;
  pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *local_a8;
  int local_9c;
  long local_98;
  double local_90;
  Phys *local_88;
  OPN2 *local_80;
  double local_78;
  size_t local_70;
  OpnInstMeta *local_68;
  size_t local_60;
  ulong local_58;
  double local_50;
  double local_48;
  double local_40;
  NoteInfo *local_38;
  
  local_80 = (this->m_synth).m_p;
  local_9c = (int)((i.cell_)->value).noteTone;
  local_40 = ((i.cell_)->value).currentTone;
  local_58 = (ulong)((i.cell_)->value).vol;
  local_60 = ((i.cell_)->value).midiins;
  local_68 = ((i.cell_)->value).ains;
  local_ac.note = ((i.cell_)->value).note;
  local_ac.MidCh = (uint16_t)midCh;
  local_70 = midCh;
  if (((i.cell_)->value).isBlank == true) {
    if ((props_mask & 0x20) != 0) {
      pl_list<OPNMIDIplay::MIDIchannel::NoteInfo>::deallocate
                (&(this->m_midiChannels).
                  super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                  ._M_impl.super__Vector_impl_data._M_start[midCh].activenotes,i.cell_);
      return;
    }
  }
  else {
    uVar21 = (ulong)((i.cell_)->value).chip_channels_count;
    if (uVar21 != 0) {
      local_38 = &(i.cell_)->value;
      pPVar19 = ((i.cell_)->value).chip_channels;
      local_a8 = i.cell_;
      do {
        instrument = &pPVar19->ains;
        uVar2 = *(ushort *)((long)(instrument + -1) + 0x1e);
        if (((props_mask & 1) != 0) && (select_adlchn < 0 || (uint)uVar2 == select_adlchn)) {
          OPN2::setPatch(local_80,(ulong)uVar2,instrument);
          uVar13 = OpnChannel::find_or_create_user
                             ((this->m_chipChannels).
                              super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar2,&local_ac);
          if (((uVar13.cell_)->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next !=
              (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0) {
            ((uVar13.cell_)->value).sustained = 0;
            ((uVar13.cell_)->value).vibdelay_us = 0;
            uVar2 = local_68->soundKeyOnMs;
            ((uVar13.cell_)->value).fixed_sustain = (ulong)uVar2 == 40000;
            ((uVar13.cell_)->value).kon_time_until_neglible_us = (ulong)uVar2 * 1000;
            uVar8 = *(undefined8 *)((long)(instrument + -1) + 0x1e);
            uVar9 = *(undefined8 *)(instrument->OPS[0].data + 6);
            uVar10 = *(undefined8 *)(instrument->OPS + 2);
            uVar11 = *(undefined8 *)(instrument->OPS[3].data + 1);
            ((uVar13.cell_)->value).ins.chip_chan = (short)uVar8;
            ((uVar13.cell_)->value).ins.ains.OPS[0].data[0] = (char)((ulong)uVar8 >> 0x10);
            ((uVar13.cell_)->value).ins.ains.OPS[0].data[1] = (char)((ulong)uVar8 >> 0x18);
            ((uVar13.cell_)->value).ins.ains.OPS[0].data[2] = (char)((ulong)uVar8 >> 0x20);
            ((uVar13.cell_)->value).ins.ains.OPS[0].data[3] = (char)((ulong)uVar8 >> 0x28);
            ((uVar13.cell_)->value).ins.ains.OPS[0].data[4] = (char)((ulong)uVar8 >> 0x30);
            ((uVar13.cell_)->value).ins.ains.OPS[0].data[5] = (char)((ulong)uVar8 >> 0x38);
            *(undefined8 *)(((uVar13.cell_)->value).ins.ains.OPS[0].data + 6) = uVar9;
            *(undefined8 *)(((uVar13.cell_)->value).ins.ains.OPS + 2) = uVar10;
            *(undefined8 *)(((uVar13.cell_)->value).ins.ains.OPS[3].data + 1) = uVar11;
            ((uVar13.cell_)->value).ins.ains.noteOffset = instrument->noteOffset;
          }
        }
        pPVar19 = (Phys *)(instrument + 1);
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
      i.cell_ = local_a8;
      if ((local_a8->value).chip_channels_count != 0) {
        pPVar19 = (local_a8->value).chip_channels;
        uVar16 = 0;
        lVar20 = local_70 * 0x140;
        local_98 = lVar20;
        local_88 = pPVar19;
        do {
          uVar2 = pPVar19[uVar16].chip_chan;
          c = (double)(ulong)uVar2;
          if ((select_adlchn < 0) || (i.cell_ = local_a8, (uint)uVar2 == select_adlchn)) {
            ph = pPVar19 + uVar16;
            if ((props_mask & 0x20) == 0) {
              if ((props_mask & 2) != 0) {
                OPN2::setPan(local_80,(size_t)c,
                             ((this->m_midiChannels).
                              super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                              ._M_impl.super__Vector_impl_data._M_start)->noteAftertouch
                             [lVar20 + 0xffffffffffffffe9]);
                pPVar19 = local_88;
                lVar20 = local_98;
              }
              if ((props_mask & 4) != 0) {
                pMVar7 = (this->m_midiChannels).
                         super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                bVar18 = pMVar7->_padding2[lVar20 + 0xfffffffffffffffe];
                if ((pMVar7->_padding2[lVar20 + 0xffffffffffffffff] & 1U) != 0) {
                  bVar18 = 0x7f;
                }
                if (local_70 == 9) {
                  bVar18 = 0x7f;
                }
                bVar17 = bVar18 * '\x02';
                if (0x3f < bVar18) {
                  bVar17 = 0x7f;
                }
                if ((this->m_setup).fullRangeBrightnessCC74 != false) {
                  bVar17 = bVar18;
                }
                OPN2::touchNote(local_80,(size_t)c,local_58,
                                (ulong)pMVar7->noteAftertouch[lVar20 + 0xffffffffffffffe7],
                                (ulong)pMVar7->noteAftertouch[local_98 + 0xffffffffffffffe8],bVar17)
                ;
                pPVar19 = local_88;
                lVar20 = local_98;
              }
              i.cell_ = local_a8;
              if ((props_mask & 8) != 0) {
                pOVar4 = (this->m_chipChannels).
                         super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ppVar14 = &pOVar4[(long)c].users.endcell_;
                for (ppVar5 = pOVar4[(long)c].users.first_;
                    (ppVar15 = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)ppVar14,
                    ppVar5 != (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)ppVar14 &&
                    ((*(uint16_t *)&ppVar5->value != local_ac.MidCh ||
                     (ppVar15 = ppVar5, *(uint8_t *)((long)&ppVar5->value + 2) != local_ac.note))));
                    ppVar5 = *(pl_cell<OPNMIDIplay::OpnChannel::LocationData> **)
                              ((long)&ppVar5->
                                      super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData> + 8
                              )) {
                }
                if (((ppVar15->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next ==
                     (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0) ||
                   (*(int *)((bool *)((long)ppVar15 + 0x10) + 4) == 0)) {
                  pMVar7 = (this->m_midiChannels).
                           super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  bVar18 = pMVar7->noteAftertouch[lVar20 + 0xffffffffffffffeb];
                  if (pMVar7->noteAftertouch[lVar20 + 0xffffffffffffffeb] <
                      pMVar7->noteAftertouch[lVar20 + 0xffffffffffffffea]) {
                    bVar18 = pMVar7->noteAftertouch[lVar20 + 0xffffffffffffffea];
                  }
                  bVar17 = (local_a8->value).vibrato;
                  if (bVar18 <= bVar17) {
                    bVar18 = bVar17;
                  }
                  dVar25 = 0.0;
                  if (((local_68->flags & 1) != 0) &&
                     (auVar24[0] = -(local_68->op[1].OPS[0].data[0] == (ph->ains).OPS[0].data[0]),
                     auVar24[1] = -(local_68->op[1].OPS[0].data[1] == (ph->ains).OPS[0].data[1]),
                     auVar24[2] = -(local_68->op[1].OPS[0].data[2] == (ph->ains).OPS[0].data[2]),
                     auVar24[3] = -(local_68->op[1].OPS[0].data[3] == (ph->ains).OPS[0].data[3]),
                     auVar24[4] = -(local_68->op[1].OPS[0].data[4] == (ph->ains).OPS[0].data[4]),
                     auVar24[5] = -(local_68->op[1].OPS[0].data[5] == (ph->ains).OPS[0].data[5]),
                     auVar24[6] = -(local_68->op[1].OPS[0].data[6] == (ph->ains).OPS[0].data[6]),
                     auVar24[7] = -(local_68->op[1].OPS[1].data[0] == (ph->ains).OPS[1].data[0]),
                     auVar24[8] = -(local_68->op[1].OPS[1].data[1] == (ph->ains).OPS[1].data[1]),
                     auVar24[9] = -(local_68->op[1].OPS[1].data[2] == (ph->ains).OPS[1].data[2]),
                     auVar24[10] = -(local_68->op[1].OPS[1].data[3] == (ph->ains).OPS[1].data[3]),
                     auVar24[0xb] = -(local_68->op[1].OPS[1].data[4] == (ph->ains).OPS[1].data[4]),
                     auVar24[0xc] = -(local_68->op[1].OPS[1].data[5] == (ph->ains).OPS[1].data[5]),
                     auVar24[0xd] = -(local_68->op[1].OPS[1].data[6] == (ph->ains).OPS[1].data[6]),
                     auVar24[0xe] = -(local_68->op[1].OPS[2].data[0] == (ph->ains).OPS[2].data[0]),
                     auVar24[0xf] = -(local_68->op[1].OPS[2].data[1] == (ph->ains).OPS[2].data[1]),
                     auVar22[0] = -(local_68->op[1].OPS[2].data[2] == (ph->ains).OPS[2].data[2]),
                     auVar22[1] = -(local_68->op[1].OPS[2].data[3] == (ph->ains).OPS[2].data[3]),
                     auVar22[2] = -(local_68->op[1].OPS[2].data[4] == (ph->ains).OPS[2].data[4]),
                     auVar22[3] = -(local_68->op[1].OPS[2].data[5] == (ph->ains).OPS[2].data[5]),
                     auVar22[4] = -(local_68->op[1].OPS[2].data[6] == (ph->ains).OPS[2].data[6]),
                     auVar22[5] = -(local_68->op[1].OPS[3].data[0] == (ph->ains).OPS[3].data[0]),
                     auVar22[6] = -(local_68->op[1].OPS[3].data[1] == (ph->ains).OPS[3].data[1]),
                     auVar22[7] = -(local_68->op[1].OPS[3].data[2] == (ph->ains).OPS[3].data[2]),
                     auVar22[8] = -(local_68->op[1].OPS[3].data[3] == (ph->ains).OPS[3].data[3]),
                     auVar22[9] = -(local_68->op[1].OPS[3].data[4] == (ph->ains).OPS[3].data[4]),
                     auVar22[10] = -(local_68->op[1].OPS[3].data[5] == (ph->ains).OPS[3].data[5]),
                     auVar22[0xb] = -(local_68->op[1].OPS[3].data[6] == (ph->ains).OPS[3].data[6]),
                     auVar22[0xc] = -(local_68->op[1].fbalg == (ph->ains).fbalg),
                     auVar22[0xd] = -(local_68->op[1].lfosens == (ph->ains).lfosens),
                     auVar22[0xe] = -((char)local_68->op[1].noteOffset ==
                                     (char)(ph->ains).noteOffset),
                     auVar22[0xf] = -(*(char *)((long)&local_68->op[1].noteOffset + 1) ==
                                     *(char *)((long)&(ph->ains).noteOffset + 1)),
                     auVar22 = auVar22 & auVar24,
                     (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff)) {
                    dVar25 = local_68->voice2_fine_tune;
                  }
                  local_90 = (double)*(int *)(pMVar7->_padding + lVar20 + 7) *
                             *(double *)(pMVar7->_padding + lVar20 + 0xf);
                  dVar23 = (double)(int)(ph->ains).noteOffset + local_90;
                  if ((bVar18 != 0) &&
                     (((ppVar15->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next ==
                       (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0 ||
                      (*(long *)(pMVar7->_padding2 + lVar20 + 0xfffffffffffffff3) <=
                       *(long *)((long)((long)ppVar15 + 0x40) + 8))))) {
                    local_50 = (double)bVar18 *
                               *(double *)(pMVar7->_padding2 + lVar20 + 0xffffffffffffffeb);
                    local_78 = dVar25;
                    local_48 = dVar23;
                    dVar25 = sin(*(double *)(pMVar7->_padding + lVar20 + 0x1f));
                    dVar23 = local_48 + dVar25 * local_50;
                    dVar25 = local_78;
                  }
                  OPN2::noteOn(local_80,(size_t)c,dVar25 + dVar23 + local_40);
                  p_Var6 = (this->hooks).onNote;
                  pPVar19 = local_88;
                  lVar20 = local_98;
                  if (p_Var6 != (NoteHook)0x0) {
                    (*p_Var6)((this->hooks).onNote_userData,(uint)uVar2,local_9c,(int)local_60,
                              (int)local_58,local_90);
                    pPVar19 = local_88;
                    lVar20 = local_98;
                  }
                }
              }
            }
            else {
              this_01 = (this->m_chipChannels).
                        super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)c;
              if (((this->m_midiChannels).
                   super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                   ._M_impl.super__Vector_impl_data._M_start)->noteAftertouch
                  [lVar20 + 0xffffffffffffffee] == '\0') {
                ppVar14 = &(this_01->users).endcell_;
                ppVar5 = (this_01->users).first_;
                while ((ppVar15 = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)ppVar14,
                       ppVar5 != (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)ppVar14 &&
                       (((ppVar5->value).loc.MidCh != local_ac.MidCh ||
                        (ppVar15 = ppVar5, (ppVar5->value).loc.note != local_ac.note))))) {
                  ppVar5 = (ppVar5->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next
                  ;
                }
                local_90 = (double)((long)c * 0x70);
                local_78 = c;
                if (((ppVar15->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next ==
                     (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0) ||
                   (((ppVar15->value).sustained & 2) != 0)) {
                  bVar12 = false;
                }
                else {
                  pl_list<OPNMIDIplay::OpnChannel::LocationData>::deallocate
                            (&this_01->users,ppVar15);
                  bVar12 = true;
                }
                p_Var6 = (this->hooks).onNote;
                if (p_Var6 != (NoteHook)0x0) {
                  (*p_Var6)((this->hooks).onNote_userData,(uint)uVar2,local_9c,(int)local_60,0,0.0);
                }
                this_00 = local_80;
                if ((bVar12) &&
                   (*(long *)((long)(&((this->m_chipChannels).
                                       super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->recent_ins + 1) +
                             (long)local_90 + 6) == 0)) {
                  OPN2::noteOff(local_80,(size_t)local_78);
                  if ((props_mask & 0x40) == 0) {
                    *(ulong *)((long)(((this->m_chipChannels).
                                       super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->recent_ins).ains.
                                     OPS + (long)local_90 + 0xfffffffffffffff6U) =
                         (ulong)local_68->soundKeyOffMs * 1000;
                  }
                  else {
                    OPN2::touchNote(this_00,(size_t)local_78,0,0x7f,0x7f,'\x7f');
                    *(undefined8 *)
                     ((long)(((this->m_chipChannels).
                              super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start)->recent_ins).ains.OPS +
                     (long)local_90 + 0xfffffffffffffff6U) = 0;
                  }
                }
              }
              else {
                uVar13 = OpnChannel::find_or_create_user(this_01,&local_ac);
                if (((uVar13.cell_)->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).
                    next != (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0) {
                  puVar1 = &((uVar13.cell_)->value).sustained;
                  *(byte *)puVar1 = (byte)*puVar1 | 1;
                }
                p_Var6 = (this->hooks).onNote;
                if (p_Var6 != (NoteHook)0x0) {
                  (*p_Var6)((this->hooks).onNote_userData,(uint)uVar2,local_9c,(int)local_60,-1,0.0)
                  ;
                }
              }
              MIDIchannel::NoteInfo::phys_erase_at(local_38,ph);
              uVar16 = uVar16 - 1;
              pPVar19 = local_88;
              lVar20 = local_98;
              i.cell_ = local_a8;
            }
          }
          uVar16 = uVar16 + 1;
          uVar3 = ((i.cell_)->value).chip_channels_count;
        } while (uVar16 < uVar3);
        if (uVar3 != 0) {
          return;
        }
      }
    }
    pMVar7 = (this->m_midiChannels).
             super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((i.cell_)->value).glideRate < INFINITY) {
      pMVar7[local_70].gliding_note_count = pMVar7[local_70].gliding_note_count - 1;
    }
    if (0.0 < ((i.cell_)->value).ttl) {
      pMVar7[local_70].extended_note_count = pMVar7[local_70].extended_note_count - 1;
    }
    pl_list<OPNMIDIplay::MIDIchannel::NoteInfo>::deallocate(&pMVar7[local_70].activenotes,i.cell_);
  }
  return;
}

Assistant:

void OPNMIDIplay::noteUpdate(size_t midCh,
                          OPNMIDIplay::MIDIchannel::notes_iterator i,
                          unsigned props_mask,
                          int32_t select_adlchn)
{
    Synth &synth = *m_synth;
    MIDIchannel::NoteInfo &info = i->value;
    const int16_t noteTone    = info.noteTone;
    const double currentTone    = info.currentTone;
    const uint8_t vol     = info.vol;
    const size_t midiins = info.midiins;
    const OpnInstMeta &ains = *info.ains;
    OpnChannel::Location my_loc;
    my_loc.MidCh = static_cast<uint16_t>(midCh);
    my_loc.note  = info.note;

    if(info.isBlank)
    {
        if(props_mask & Upd_Off)
            m_midiChannels[midCh].activenotes.erase(i);
        return;
    }

    for(unsigned ccount = 0, ctotal = info.chip_channels_count; ccount < ctotal; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c   = ins.chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn) continue;

        if(props_mask & Upd_Patch)
        {
            synth.setPatch(c, ins.ains);
            OpnChannel::users_iterator ci = m_chipChannels[c].find_or_create_user(my_loc);
            if(!ci.is_end())    // inserts if necessary
            {
                OpnChannel::LocationData &d = ci->value;
                d.sustained = OpnChannel::LocationData::Sustain_None;
                d.vibdelay_us  = 0;
                d.fixed_sustain = (ains.soundKeyOnMs == static_cast<uint16_t>(opnNoteOnMaxTime));
                d.kon_time_until_neglible_us = 1000 * ains.soundKeyOnMs;
                d.ins       = ins;
            }
        }
    }

    for(unsigned ccount = 0; ccount < info.chip_channels_count; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c   = ins.chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn)
            continue;

        if(props_mask & Upd_Off) // note off
        {
            if(m_midiChannels[midCh].sustain == 0)
            {
                OpnChannel::users_iterator k = m_chipChannels[c].find_user(my_loc);
                bool do_erase_user = (!k.is_end() && ((k->value.sustained & OpnChannel::LocationData::Sustain_Sostenuto) == 0));
                if(do_erase_user)
                    m_chipChannels[c].users.erase(k);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, static_cast<int>(midiins), 0, 0.0);

                if(do_erase_user && m_chipChannels[c].users.empty())
                {
                    synth.noteOff(c);
                    if(props_mask & Upd_Mute) // Mute the note
                    {
                        synth.touchNote(c, 0);
                        m_chipChannels[c].koff_time_until_neglible_us = 0;
                    }
                    else
                    {
                        m_chipChannels[c].koff_time_until_neglible_us = 1000 * int64_t(ains.soundKeyOffMs);
                    }
                }
            }
            else
            {
                // Sustain: Forget about the note, but don't key it off.
                //          Also will avoid overwriting it very soon.
                OpnChannel::users_iterator d = m_chipChannels[c].find_or_create_user(my_loc);
                if(!d.is_end())
                    d->value.sustained |= OpnChannel::LocationData::Sustain_Pedal; // note: not erased!
                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, static_cast<int>(midiins), -1, 0.0);
            }

            info.phys_erase_at(&ins);  // decrements channel count
            --ccount;  // adjusts index accordingly
            continue;
        }

        if(props_mask & Upd_Pan)
            synth.setPan(c, m_midiChannels[midCh].panning);

        if(props_mask & Upd_Volume)
        {
            const MIDIchannel &ch = m_midiChannels[midCh];
            bool is_percussion = (midCh == 9) || ch.is_xg_percussion;
            uint_fast32_t brightness = is_percussion ? 127 : ch.brightness;

            if(!m_setup.fullRangeBrightnessCC74)
            {
                // Simulate post-High-Pass filter result which affects sounding by half level only
                if(brightness >= 64)
                    brightness = 127;
                else
                    brightness *= 2;
            }

            synth.touchNote(c,
                            vol,
                            ch.volume,
                            ch.expression,
                            static_cast<uint8_t>(brightness));
        }

        if(props_mask & Upd_Pitch)
        {
            OpnChannel::users_iterator d = m_chipChannels[c].find_user(my_loc);

            // Don't bend a sustained note
            if(d.is_end() || (d->value.sustained == OpnChannel::LocationData::Sustain_None))
            {
                MIDIchannel &chan = m_midiChannels[midCh];
                double midibend = chan.bend * chan.bendsense;
                double bend = midibend + ins.ains.noteOffset;
                double phase = 0.0;
                uint8_t vibrato = std::max(chan.vibrato, chan.aftertouch);

                vibrato = std::max(vibrato, info.vibrato);

                if((ains.flags & OpnInstMeta::Flag_Pseudo8op) && ins.ains == ains.op[1])
                {
                    phase = ains.voice2_fine_tune;
                }

                if(vibrato && (d.is_end() || d->value.vibdelay_us >= chan.vibdelay_us))
                    bend += static_cast<double>(vibrato) * chan.vibdepth * std::sin(chan.vibpos);

                synth.noteOn(c, currentTone + bend + phase);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, static_cast<int>(midiins), vol, midibend);
            }
        }
    }

    if(info.chip_channels_count == 0)
    {
        m_midiChannels[midCh].cleanupNote(i);
        m_midiChannels[midCh].activenotes.erase(i);
    }
}